

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterFullEndElement(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk;
  undefined8 *puVar5;
  int iVar6;
  
  iVar6 = -1;
  if (writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  if (lk == (xmlLinkPtr)0x0) {
    return -1;
  }
  puVar5 = (undefined8 *)xmlLinkGetData(lk);
  if (puVar5 == (undefined8 *)0x0) {
    return -1;
  }
  iVar1 = *(int *)(puVar5 + 1);
  if (iVar1 == 1) {
    iVar1 = 0;
LAB_001d1e54:
    iVar2 = xmlTextWriterOutputNSDecl(writer);
    if (iVar2 < 0) {
      return -1;
    }
    iVar3 = xmlOutputBufferWriteString(writer->out,">");
    if (iVar3 < 0) {
      return -1;
    }
    iVar3 = iVar2 + iVar1 + iVar3;
    if (writer->indent == 0) goto LAB_001d1eac;
    writer->doindent = 0;
  }
  else {
    if (iVar1 != 3) {
      if (iVar1 != 2) {
        return -1;
      }
      iVar1 = xmlTextWriterEndAttribute(writer);
      if (iVar1 < 0) {
        return -1;
      }
      goto LAB_001d1e54;
    }
    iVar3 = 0;
    if (writer->indent == 0) goto LAB_001d1eac;
  }
  if (writer->doindent != 0) {
    iVar1 = xmlTextWriterWriteIndent(writer);
    iVar3 = iVar3 + iVar1;
  }
LAB_001d1eac:
  writer->doindent = 1;
  iVar1 = xmlOutputBufferWriteString(writer->out,"</");
  if (((-1 < iVar1) && (iVar2 = xmlOutputBufferWriteString(writer->out,(char *)*puVar5), -1 < iVar2)
      ) && (iVar4 = xmlOutputBufferWriteString(writer->out,">"), -1 < iVar4)) {
    iVar6 = iVar1 + iVar3 + iVar4 + iVar2;
    if (writer->indent != 0) {
      iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
      iVar6 = iVar6 + iVar1;
    }
    xmlListPopFront(writer->nodes);
  }
  return iVar6;
}

Assistant:

int
xmlTextWriterFullEndElement(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        return -1;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            count = xmlTextWriterEndAttribute(writer);
            if (count < 0)
                return -1;
            sum += count;
            /* fallthrough */
        case XML_TEXTWRITER_NAME:
            /* Output namespace declarations */
            count = xmlTextWriterOutputNSDecl(writer);
            if (count < 0)
                return -1;
            sum += count;

            count = xmlOutputBufferWriteString(writer->out, ">");
            if (count < 0)
                return -1;
            sum += count;
            if (writer->indent)
                writer->doindent = 0;
            /* fallthrough */
        case XML_TEXTWRITER_TEXT:
            if ((writer->indent) && (writer->doindent)) {
                count = xmlTextWriterWriteIndent(writer);
                sum += count;
                writer->doindent = 1;
            } else
                writer->doindent = 1;
            count = xmlOutputBufferWriteString(writer->out, "</");
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out,
                                               (const char *) p->name);
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, ">");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    if (writer->indent) {
        count = xmlOutputBufferWriteString(writer->out, "\n");
        sum += count;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}